

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_vexp_if.c
# Opt level: O0

void expr_ff(t_expr *x)

{
  int local_1c;
  _exprproxy *p_Stack_18;
  int i;
  t_exprproxy *y;
  t_expr *x_local;
  
  p_Stack_18 = x->exp_proxy;
  while (p_Stack_18 != (_exprproxy *)0x0) {
    x->exp_proxy = p_Stack_18->p_next;
    pd_free(&p_Stack_18->p_pd);
    p_Stack_18 = x->exp_proxy;
  }
  for (local_1c = 0; local_1c < x->exp_nexpr; local_1c = local_1c + 1) {
    if (x->exp_stack[local_1c] != (ex_ex *)0x0) {
      free(x->exp_stack[local_1c]);
    }
  }
  for (local_1c = 0; local_1c < 100; local_1c = local_1c + 1) {
    if (x->exp_p_var[local_1c] != (t_float *)0x0) {
      free(x->exp_p_var[local_1c]);
    }
    if (x->exp_p_res[local_1c] != (t_float *)0x0) {
      free(x->exp_p_res[local_1c]);
    }
    if (x->exp_tmpres[local_1c] != (t_float *)0x0) {
      free(x->exp_tmpres[local_1c]);
    }
  }
  return;
}

Assistant:

static void
expr_ff(t_expr *x)
{
        t_exprproxy *y;
        int i;

        y = x->exp_proxy;
        while (y)
        {
                x->exp_proxy = y->p_next;
#ifdef PD
                pd_free(&y->p_pd);
#else /*MSP */
        /* SDY find out what needs to be called for MSP */

#endif
                y = x->exp_proxy;
        }
        for (i = 0 ; i < x->exp_nexpr; i++)
                if (x->exp_stack[i])
                        fts_free(x->exp_stack[i]);
/*
 * SDY free all the allocated buffers here for expr~ and fexpr~
 * check to see if there are others
 */
        for (i = 0; i < MAX_VARS; i++) {
                if (x->exp_p_var[i])
                        fts_free(x->exp_p_var[i]);
                if (x->exp_p_res[i])
                        fts_free(x->exp_p_res[i]);
                if (x->exp_tmpres[i])
                        fts_free(x->exp_tmpres[i]);
        }


}